

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O0

void Gia_ManCofOneDerive_rec(Ccf_Man_t *p,int Id)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  int Id_00;
  int Id_01;
  Gia_Obj_t *pObj_00;
  int Fan1;
  int Fan0;
  int fCompl1;
  int fCompl0;
  int Res;
  Gia_Obj_t *pObj;
  int Id_local;
  Ccf_Man_t *p_local;
  
  iVar1 = Vec_IntEntry(p->vCopies,Id);
  if (iVar1 == -1) {
    pObj_00 = Gia_ManObj(p->pFrames,Id);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if ((iVar1 == 0) && (iVar1 = Gia_ObjIsAnd(pObj_00), iVar1 == 0)) {
      __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCCof.c"
                    ,0xa0,"void Gia_ManCofOneDerive_rec(Ccf_Man_t *, int)");
    }
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjCioId(pObj_00);
      iVar2 = Gia_ManRegNum(p->pGia);
      if (iVar1 < iVar2) {
        fCompl1 = Abc_Var2Lit(Id,0);
      }
      else {
        fCompl1 = sat_solver_var_value(p->pSat,Id);
      }
    }
    else {
      iVar1 = Gia_ObjFaninC0(pObj_00);
      iVar2 = Gia_ObjFaninC1(pObj_00);
      Id_00 = Gia_ObjFaninId0p(p->pFrames,pObj_00);
      Id_01 = Gia_ObjFaninId1p(p->pFrames,pObj_00);
      Gia_ManCofOneDerive_rec(p,Id_00);
      Gia_ManCofOneDerive_rec(p,Id_01);
      p_00 = p->pFrames;
      iVar1 = Gia_Obj0Copy(p->vCopies,Id_00,iVar1);
      iVar2 = Gia_Obj1Copy(p->vCopies,Id_01,iVar2);
      fCompl1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
    }
    Vec_IntWriteEntry(p->vCopies,Id,fCompl1);
  }
  return;
}

Assistant:

void Gia_ManCofOneDerive_rec( Ccf_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    int Res;
    if ( Vec_IntEntry(p->vCopies, Id) != -1 )
        return;
    pObj = Gia_ManObj(p->pFrames, Id);
    assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsAnd(pObj) )
    {
        int fCompl0 = Gia_ObjFaninC0(pObj);
        int fCompl1 = Gia_ObjFaninC1(pObj);
        int Fan0 = Gia_ObjFaninId0p(p->pFrames, pObj);
        int Fan1 = Gia_ObjFaninId1p(p->pFrames, pObj);
        Gia_ManCofOneDerive_rec( p, Fan0 );
        Gia_ManCofOneDerive_rec( p, Fan1 );
        Res = Gia_ManHashAnd( p->pFrames, 
            Gia_Obj0Copy(p->vCopies, Fan0, fCompl0), 
            Gia_Obj1Copy(p->vCopies, Fan1, fCompl1) );
    }
    else if ( Gia_ObjCioId(pObj) >= Gia_ManRegNum(p->pGia) ) // PI
        Res = sat_solver_var_value( p->pSat, Id );
    else
        Res = Abc_Var2Lit( Id, 0 );
    Vec_IntWriteEntry( p->vCopies, Id, Res );
}